

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

char * lua_getupvalue(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  char *pcVar2;
  TValue *val;
  GCobj *o;
  TValue *local_28;
  GCobj *local_20;
  
  pTVar1 = index2adr(L,idx);
  pcVar2 = lj_debug_uvnamev(pTVar1,n - 1,&local_28,&local_20);
  if (pcVar2 != (char *)0x0) {
    *L->top = *local_28;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
      lj_state_growstack1(L);
    }
  }
  return pcVar2;
}

Assistant:

LUA_API const char *lua_getupvalue(lua_State *L, int idx, int n)
{
  TValue *val;
  GCobj *o;
  const char *name = lj_debug_uvnamev(index2adr(L, idx), (uint32_t)(n-1), &val, &o);
  if (name) {
    copyTV(L, L->top, val);
    incr_top(L);
  }
  return name;
}